

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O3

bool __thiscall duckdb::LikeMatcher::Match(LikeMatcher *this,string_t *str)

{
  vector<duckdb::LikeSegment,_true> *this_00;
  pointer pLVar1;
  pointer pLVar2;
  int iVar3;
  reference pvVar4;
  idx_t iVar5;
  long lVar6;
  idx_t iVar7;
  char *haystack;
  size_type __n;
  ulong haystack_size;
  ulong uVar8;
  bool bVar9;
  
  haystack_size = (ulong)(str->value).pointer.length;
  if (haystack_size < 0xd) {
    haystack = (str->value).pointer.prefix;
  }
  else {
    haystack = (str->value).pointer.ptr;
  }
  this_00 = &this->segments;
  pLVar1 = (this->segments).super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
           super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar2 = (this->segments).super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
           super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->has_start_percentage == false) {
    pvVar4 = vector<duckdb::LikeSegment,_true>::operator[](this_00,0);
    uVar8 = (pvVar4->pattern)._M_string_length;
    bVar9 = haystack_size < uVar8;
    haystack_size = haystack_size - uVar8;
    if (bVar9) {
      return false;
    }
    iVar3 = bcmp(haystack,(pvVar4->pattern)._M_dataplus._M_p,uVar8);
    if (iVar3 != 0) {
      return false;
    }
    if ((long)(this->segments).
              super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
              super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->segments).
              super_vector<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>.
              super__Vector_base<duckdb::LikeSegment,_std::allocator<duckdb::LikeSegment>_>._M_impl.
              super__Vector_impl_data._M_start == 0x20) {
      return (bool)(haystack_size == 0 | this->has_end_percentage);
    }
    haystack = haystack + uVar8;
    __n = 1;
  }
  else {
    __n = 0;
  }
  uVar8 = ((long)pLVar1 - (long)pLVar2 >> 5) - 1;
  if (__n < uVar8) {
    do {
      pvVar4 = vector<duckdb::LikeSegment,_true>::operator[](this_00,__n);
      iVar7 = (pvVar4->pattern)._M_string_length;
      iVar5 = FindStrInStr((uchar *)haystack,haystack_size,
                           (uchar *)(pvVar4->pattern)._M_dataplus._M_p,iVar7);
      if (iVar5 == 0xffffffffffffffff) {
        return false;
      }
      lVar6 = iVar5 + iVar7;
      haystack = haystack + lVar6;
      haystack_size = haystack_size - lVar6;
      __n = __n + 1;
    } while (uVar8 != __n);
  }
  bVar9 = this->has_end_percentage;
  pvVar4 = vector<duckdb::LikeSegment,_true>::back(this_00);
  if (bVar9 == false) {
    uVar8 = (pvVar4->pattern)._M_string_length;
    if (haystack_size < uVar8) {
      return false;
    }
    iVar3 = bcmp(haystack + (haystack_size - uVar8),(pvVar4->pattern)._M_dataplus._M_p,uVar8);
    return iVar3 == 0;
  }
  iVar7 = FindStrInStr((uchar *)haystack,haystack_size,(uchar *)(pvVar4->pattern)._M_dataplus._M_p,
                       (pvVar4->pattern)._M_string_length);
  return iVar7 != 0xffffffffffffffff;
}

Assistant:

bool Match(string_t &str) {
		auto str_data = const_uchar_ptr_cast(str.GetData());
		auto str_len = str.GetSize();
		idx_t segment_idx = 0;
		idx_t end_idx = segments.size() - 1;
		if (!has_start_percentage) {
			// no start sample_size: match the first part of the string directly
			auto &segment = segments[0];
			if (str_len < segment.pattern.size()) {
				return false;
			}
			if (memcmp(str_data, segment.pattern.c_str(), segment.pattern.size()) != 0) {
				return false;
			}
			str_data += segment.pattern.size();
			str_len -= segment.pattern.size();
			segment_idx++;
			if (segments.size() == 1) {
				// only one segment, and it matches
				// we have a match if there is an end sample_size, OR if the memcmp was an exact match (remaining str is
				// empty)
				return has_end_percentage || str_len == 0;
			}
		}
		// main match loop: for every segment in the middle, use Contains to find the needle in the haystack
		for (; segment_idx < end_idx; segment_idx++) {
			auto &segment = segments[segment_idx];
			// find the pattern of the current segment
			idx_t next_offset =
			    FindStrInStr(str_data, str_len, const_uchar_ptr_cast(segment.pattern.c_str()), segment.pattern.size());
			if (next_offset == DConstants::INVALID_INDEX) {
				// could not find this pattern in the string: no match
				return false;
			}
			idx_t offset = next_offset + segment.pattern.size();
			str_data += offset;
			str_len -= offset;
		}
		if (!has_end_percentage) {
			end_idx--;
			// no end sample_size: match the final segment now
			auto &segment = segments.back();
			if (str_len < segment.pattern.size()) {
				return false;
			}
			if (memcmp(str_data + str_len - segment.pattern.size(), segment.pattern.c_str(), segment.pattern.size()) !=
			    0) {
				return false;
			}
			return true;
		} else {
			auto &segment = segments.back();
			// find the pattern of the current segment
			idx_t next_offset =
			    FindStrInStr(str_data, str_len, const_uchar_ptr_cast(segment.pattern.c_str()), segment.pattern.size());
			return next_offset != DConstants::INVALID_INDEX;
		}
	}